

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_lib_init(void)

{
  fio_data_s *__tp;
  rlim_t rVar1;
  int iVar2;
  __pid_t _Var3;
  ulong uVar4;
  size_t sVar5;
  block_s *blk;
  char *__s;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  uint uVar9;
  size_t __n;
  ulong uVar10;
  rlimit rlim;
  rlimit local_48;
  
  uVar4 = sysconf(4);
  local_48.rlim_cur = 0;
  local_48.rlim_max = 0;
  iVar2 = getrlimit(RLIMIT_NOFILE,&local_48);
  rVar1 = local_48.rlim_cur;
  if (iVar2 == -1) {
    fio_lib_init_cold_1();
  }
  else {
    if (0x20000 < local_48.rlim_max) {
      local_48.rlim_max = 0x20000;
    }
    local_48.rlim_cur = local_48.rlim_max;
    iVar2 = setrlimit(RLIMIT_NOFILE,&local_48);
    if (rVar1 < local_48.rlim_cur && iVar2 == -1) {
      do {
        local_48.rlim_cur = local_48.rlim_cur - 1;
        iVar2 = setrlimit(RLIMIT_NOFILE,&local_48);
        if (iVar2 != -1) break;
      } while (rVar1 < local_48.rlim_cur);
    }
    getrlimit(RLIMIT_NOFILE,&local_48);
    uVar4 = local_48.rlim_cur - 0x10;
    if ((long)local_48.rlim_cur < 0x401) {
      uVar4 = local_48.rlim_cur;
    }
  }
  if (arenas == (arena_s *)0x0) {
    sVar5 = sysconf(0x54);
    memory.cores = 8;
    if (0 < (long)sVar5) {
      memory.cores = sVar5;
    }
    arenas = (arena_s *)big_alloc(memory.cores << 4);
    if (arenas != (arena_s *)0x0) {
      blk = block_new();
      block_free(blk);
      pthread_atfork((__prepare *)0x0,(__parent *)0x0,fio_malloc_after_fork);
      goto LAB_0012ed72;
    }
    if (FIO_LOG_LEVEL < 1) goto LAB_0012ef78;
    pcVar8 = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7305"
    ;
  }
  else {
LAB_0012ed72:
    fio_poll_init();
    fio_cluster_data_cleanup(0);
    __s = getenv("TMPDIR");
    __n = 4;
    pcVar8 = "/tmp";
    if (__s == (char *)0x0) {
LAB_0012edc6:
      uVar9 = (uint)__n;
      memcpy(cluster_data.name,pcVar8,__n);
      if (cluster_data.name[uVar9 - 1] != '/') {
        uVar9 = uVar9 + 1;
        cluster_data.name[__n] = '/';
      }
      uVar10 = (ulong)uVar9;
    }
    else {
      sVar6 = strlen(__s);
      if ((0xe3 < (uint)sVar6) ||
         ((uVar10 = 0, (char)sVar6 != '\0' &&
          (__n = sVar6 & 0xffffffff, pcVar8 = __s, ((uint)sVar6 & 0xff) != 0xe3))))
      goto LAB_0012edc6;
    }
    builtin_strncpy(cluster_data.name + uVar10 + 6,"io-sock-",8);
    builtin_strncpy(cluster_data.name + uVar10,"facil-io",8);
    uVar9 = getpid();
    iVar2 = snprintf(cluster_data.name + uVar10 + 0xe,(ulong)(0xf1 - (int)uVar10),"%d",(ulong)uVar9)
    ;
    cluster_data.name[iVar2 + (int)uVar10 + 0xe] = '\0';
    unlink(cluster_data.name);
    fio_state_callback_add(FIO_CALL_AT_EXIT,fio_cluster_cleanup,(void *)0x0);
    fio_state_callback_add(FIO_CALL_PRE_START,fio_listen2cluster,(void *)0x0);
    fio_state_callback_add(FIO_CALL_IN_MASTER,fio_accept_after_fork,(void *)0x0);
    fio_state_callback_add(FIO_CALL_IN_CHILD,fio_connect2cluster,(void *)0x0);
    fio_state_callback_add(FIO_CALL_ON_FINISH,fio_cluster_cleanup,(void *)0x0);
    fio_state_callback_add(FIO_CALL_AT_EXIT,fio_cluster_at_exit,(void *)0x0);
    sVar5 = uVar4 * 0xa8 + 0x40;
    if (sVar5 == 0) {
      fio_data = (fio_data_s *)0x0;
    }
    else {
      fio_data = (fio_data_s *)big_alloc(sVar5);
      if (fio_data != (fio_data_s *)0x0) {
        fio_data->capa = (uint32_t)uVar4;
        _Var3 = getpid();
        __tp = fio_data;
        fio_data->parent = _Var3;
        __tp->connection_count = 0;
        clock_gettime(0,(timespec *)__tp);
        if (0 < (long)uVar4) {
          uVar10 = 0;
          do {
            fio_clear_fd(uVar10,'\0');
            uVar10 = uVar10 + 1;
          } while (uVar4 != uVar10);
        }
        fio_state_callback_force(FIO_CALL_ON_INITIALIZE);
        fio_state_callback_clear(FIO_CALL_ON_INITIALIZE);
        return;
      }
    }
    if (FIO_LOG_LEVEL < 1) goto LAB_0012ef78;
    pcVar8 = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:3623"
    ;
  }
  FIO_LOG2STDERR(pcVar8);
LAB_0012ef78:
  kill(0,2);
  piVar7 = __errno_location();
  exit(*piVar7);
}

Assistant:

static void __attribute__((constructor)) fio_lib_init(void) {
  /* detect socket capacity - MUST be first...*/
  ssize_t capa = 0;
  {
#ifdef _SC_OPEN_MAX
    capa = sysconf(_SC_OPEN_MAX);
#elif defined(FOPEN_MAX)
    capa = FOPEN_MAX;
#endif
    // try to maximize limits - collect max and set to max
    struct rlimit rlim = {.rlim_max = 0};
    if (getrlimit(RLIMIT_NOFILE, &rlim) == -1) {
      FIO_LOG_WARNING("`getrlimit` failed in `fio_lib_init`.");
      perror("\terrno:");
    } else {
      rlim_t original = rlim.rlim_cur;
      rlim.rlim_cur = rlim.rlim_max;
      if (rlim.rlim_cur > FIO_MAX_SOCK_CAPACITY) {
        rlim.rlim_cur = rlim.rlim_max = FIO_MAX_SOCK_CAPACITY;
      }
      while (setrlimit(RLIMIT_NOFILE, &rlim) == -1 && rlim.rlim_cur > original)
        --rlim.rlim_cur;
      getrlimit(RLIMIT_NOFILE, &rlim);
      capa = rlim.rlim_cur;
      if (capa > 1024) /* leave a slice of room */
        capa -= 16;
    }
    /* initialize memory allocator */
    fio_mem_init();
    /* initialize polling engine */
    fio_poll_init();
    /* initialize the cluster engine */
    fio_pubsub_initialize();
#if DEBUG
#if FIO_ENGINE_POLL
    FIO_LOG_INFO("facil.io " FIO_VERSION_STRING " capacity initialization:\n"
                 "*    Meximum open files %zu out of %zu\n"
                 "*    Allocating %zu bytes for state handling.\n"
                 "*    %zu bytes per connection + %zu for state handling.",
                 capa, (size_t)rlim.rlim_max,
                 (sizeof(*fio_data) + (capa * (sizeof(*fio_data->poll))) +
                  (capa * (sizeof(*fio_data->info)))),
                 (sizeof(*fio_data->poll) + sizeof(*fio_data->info)),
                 sizeof(*fio_data));
#else
    FIO_LOG_INFO("facil.io " FIO_VERSION_STRING " capacity initialization:\n"
                 "*    Meximum open files %zu out of %zu\n"
                 "*    Allocating %zu bytes for state handling.\n"
                 "*    %zu bytes per connection + %zu for state handling.",
                 capa, (size_t)rlim.rlim_max,
                 (sizeof(*fio_data) + (capa * (sizeof(*fio_data->info)))),
                 (sizeof(*fio_data->info)), sizeof(*fio_data));
#endif
#endif
  }

#if FIO_ENGINE_POLL
  /* allocate and initialize main data structures by detected capacity */
  fio_data = fio_mmap(sizeof(*fio_data) + (capa * (sizeof(*fio_data->poll))) +
                      (capa * (sizeof(*fio_data->info))));
  FIO_ASSERT_ALLOC(fio_data);
  fio_data->capa = capa;
  fio_data->poll =
      (void *)((uintptr_t)(fio_data + 1) + (sizeof(fio_data->info[0]) * capa));
#else
  /* allocate and initialize main data structures by detected capacity */
  fio_data = fio_mmap(sizeof(*fio_data) + (capa * (sizeof(*fio_data->info))));
  FIO_ASSERT_ALLOC(fio_data);
  fio_data->capa = capa;
#endif
  fio_data->parent = getpid();
  fio_data->connection_count = 0;
  fio_mark_time();

  for (ssize_t i = 0; i < capa; ++i) {
    fio_clear_fd(i, 0);
#if FIO_ENGINE_POLL
    fio_data->poll[i].fd = -1;
#endif
  }

  /* call initialization callbacks */
  fio_state_callback_force(FIO_CALL_ON_INITIALIZE);
  fio_state_callback_clear(FIO_CALL_ON_INITIALIZE);
}